

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cpp.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerCPP::emit_header(CompilerCPP *this)

{
  SPIREntryPoint *pSVar1;
  CompilerError *this_00;
  char *pcVar2;
  char *pcVar3;
  _Alloc_hider in_stack_ffffffffffffffc8;
  char local_28 [16];
  
  pSVar1 = Compiler::get_entry_point((Compiler *)this);
  CompilerGLSL::statement<char_const(&)[52]>
            (&this->super_CompilerGLSL,
             (char (*) [52])"// This C++ shader is autogenerated by spirv-cross.");
  CompilerGLSL::statement<char_const(&)[46]>
            (&this->super_CompilerGLSL,
             (char (*) [46])"#include \"spirv_cross/internal_interface.hpp\"");
  CompilerGLSL::statement<char_const(&)[44]>
            (&this->super_CompilerGLSL,
             (char (*) [44])"#include \"spirv_cross/external_interface.h\"");
  CompilerGLSL::statement<char_const(&)[17]>
            (&this->super_CompilerGLSL,(char (*) [17])"#include <array>");
  CompilerGLSL::statement<char_const(&)[20]>
            (&this->super_CompilerGLSL,(char (*) [20])"#include <stdint.h>");
  CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x34ea49);
  CompilerGLSL::statement<char_const(&)[29]>
            (&this->super_CompilerGLSL,(char (*) [29])"using namespace spirv_cross;");
  CompilerGLSL::statement<char_const(&)[21]>
            (&this->super_CompilerGLSL,(char (*) [21])"using namespace glm;");
  CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x34ea49);
  CompilerGLSL::statement<char_const(&)[15]>
            (&this->super_CompilerGLSL,(char (*) [15])"namespace Impl");
  CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
  if (pSVar1->model < ExecutionModelKernel) {
    CompilerGLSL::statement<char_const(&)[14]>
              (&this->super_CompilerGLSL,(char (*) [14])"struct Shader");
    CompilerGLSL::begin_scope(&this->super_CompilerGLSL);
    switch(pSVar1->model) {
    case ExecutionModelVertex:
      ::std::__cxx11::string::_M_replace
                ((ulong)&this->impl_type,0,(char *)(this->impl_type)._M_string_length,0x398d65);
      pcVar3 = (char *)(this->resource_type)._M_string_length;
      pcVar2 = "VertexResources";
      break;
    case ExecutionModelTessellationControl:
      ::std::__cxx11::string::_M_replace
                ((ulong)&this->impl_type,0,(char *)(this->impl_type)._M_string_length,0x398e38);
      pcVar3 = (char *)(this->resource_type)._M_string_length;
      pcVar2 = "TessControlResources";
      break;
    case ExecutionModelTessellationEvaluation:
      ::std::__cxx11::string::_M_replace
                ((ulong)&this->impl_type,0,(char *)(this->impl_type)._M_string_length,0x398e86);
      pcVar3 = (char *)(this->resource_type)._M_string_length;
      pcVar2 = "TessEvaluationResources";
      break;
    case ExecutionModelGeometry:
      ::std::__cxx11::string::_M_replace
                ((ulong)&this->impl_type,0,(char *)(this->impl_type)._M_string_length,0x398d1d);
      pcVar3 = (char *)(this->resource_type)._M_string_length;
      pcVar2 = "GeometryResources";
      break;
    case ExecutionModelFragment:
      ::std::__cxx11::string::_M_replace
                ((ulong)&this->impl_type,0,(char *)(this->impl_type)._M_string_length,0x398da9);
      pcVar3 = (char *)(this->resource_type)._M_string_length;
      pcVar2 = "FragmentResources";
      break;
    case ExecutionModelGLCompute:
      join<char_const(&)[54],unsigned_int&,char_const(&)[3],unsigned_int&,char_const(&)[3],unsigned_int&,char_const(&)[2]>
                ((string *)&stack0xffffffffffffffc8,
                 (spirv_cross *)"ComputeShader<Impl::Shader, Impl::Shader::Resources, ",
                 (char (*) [54])&pSVar1->workgroup_size,(uint *)0x394b62,
                 (char (*) [3])&(pSVar1->workgroup_size).y,(uint *)0x394b62,
                 (char (*) [3])&(pSVar1->workgroup_size).z,(uint *)0x395c2f,
                 (char (*) [2])in_stack_ffffffffffffffc8._M_p);
      ::std::__cxx11::string::operator=
                ((string *)&this->impl_type,(string *)&stack0xffffffffffffffc8);
      if ((char (*) [2])in_stack_ffffffffffffffc8._M_p != (char (*) [2])local_28) {
        operator_delete(in_stack_ffffffffffffffc8._M_p);
      }
      ::std::__cxx11::string::_M_replace
                ((ulong)&this->resource_type,0,(char *)(this->resource_type)._M_string_length,
                 0x398e27);
      return;
    default:
      this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(this_00,"Unsupported execution model.");
      goto LAB_002aeff3;
    }
    ::std::__cxx11::string::_M_replace((ulong)&this->resource_type,0,pcVar3,(ulong)pcVar2);
    return;
  }
  this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
  CompilerError::CompilerError(this_00,"Unsupported execution model.");
LAB_002aeff3:
  __cxa_throw(this_00,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CompilerCPP::emit_header()
{
	auto &execution = get_entry_point();

	statement("// This C++ shader is autogenerated by spirv-cross.");
	statement("#include \"spirv_cross/internal_interface.hpp\"");
	statement("#include \"spirv_cross/external_interface.h\"");
	// Needed to properly implement GLSL-style arrays.
	statement("#include <array>");
	statement("#include <stdint.h>");
	statement("");
	statement("using namespace spirv_cross;");
	statement("using namespace glm;");
	statement("");

	statement("namespace Impl");
	begin_scope();

	switch (execution.model)
	{
	case ExecutionModelGeometry:
	case ExecutionModelTessellationControl:
	case ExecutionModelTessellationEvaluation:
	case ExecutionModelGLCompute:
	case ExecutionModelFragment:
	case ExecutionModelVertex:
		statement("struct Shader");
		begin_scope();
		break;

	default:
		SPIRV_CROSS_THROW("Unsupported execution model.");
	}

	switch (execution.model)
	{
	case ExecutionModelGeometry:
		impl_type = "GeometryShader<Impl::Shader, Impl::Shader::Resources>";
		resource_type = "GeometryResources";
		break;

	case ExecutionModelVertex:
		impl_type = "VertexShader<Impl::Shader, Impl::Shader::Resources>";
		resource_type = "VertexResources";
		break;

	case ExecutionModelFragment:
		impl_type = "FragmentShader<Impl::Shader, Impl::Shader::Resources>";
		resource_type = "FragmentResources";
		break;

	case ExecutionModelGLCompute:
		impl_type = join("ComputeShader<Impl::Shader, Impl::Shader::Resources, ", execution.workgroup_size.x, ", ",
		                 execution.workgroup_size.y, ", ", execution.workgroup_size.z, ">");
		resource_type = "ComputeResources";
		break;

	case ExecutionModelTessellationControl:
		impl_type = "TessControlShader<Impl::Shader, Impl::Shader::Resources>";
		resource_type = "TessControlResources";
		break;

	case ExecutionModelTessellationEvaluation:
		impl_type = "TessEvaluationShader<Impl::Shader, Impl::Shader::Resources>";
		resource_type = "TessEvaluationResources";
		break;

	default:
		SPIRV_CROSS_THROW("Unsupported execution model.");
	}
}